

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cc
# Opt level: O0

string * __thiscall
phosg::name_for_pid_abi_cxx11_(string *__return_storage_ptr__,phosg *this,pid_t pid)

{
  _Head_base<0UL,__IO_FILE_*,_false> *__return_storage_ptr___00;
  int iVar1;
  char *__s;
  FILE *__stream;
  char local_a8;
  allocator<char> local_a1;
  int ch;
  allocator<char> local_69;
  string local_68;
  undefined1 local_48 [8];
  unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)> f;
  string command;
  pid_t pid_local;
  string *name;
  
  __return_storage_ptr___00 =
       &f._M_t.super___uniq_ptr_impl<_IO_FILE,_void_(*)(_IO_FILE_*)>._M_t.
        super__Tuple_impl<0UL,__IO_FILE_*,_void_(*)(_IO_FILE_*)>.
        super__Head_base<0UL,__IO_FILE_*,_false>;
  string_printf_abi_cxx11_
            ((string *)__return_storage_ptr___00,
             "ps -ax -c -o pid -o command | grep ^\\ *%u\\ | sed s/[0-9]*\\ //g",
             (ulong)this & 0xffffffff);
  __s = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr___00);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,__s,&local_69);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&ch,"r",&local_a1);
  popen_unique((phosg *)local_48,&local_68,(string *)&ch);
  ::std::__cxx11::string::~string((string *)&ch);
  ::std::allocator<char>::~allocator(&local_a1);
  ::std::__cxx11::string::~string((string *)&local_68);
  ::std::allocator<char>::~allocator(&local_69);
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  while( true ) {
    __stream = (FILE *)::std::unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)>::get
                                 ((unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)> *)local_48);
    iVar1 = fgetc(__stream);
    if (iVar1 == -1) break;
    if ((0x1f < iVar1) && (iVar1 < 0x7f)) {
      local_a8 = (char)iVar1;
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (__return_storage_ptr__,local_a8);
    }
  }
  ::std::unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)>::~unique_ptr
            ((unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)> *)local_48);
  ::std::__cxx11::string::~string
            ((string *)
             &f._M_t.super___uniq_ptr_impl<_IO_FILE,_void_(*)(_IO_FILE_*)>._M_t.
              super__Tuple_impl<0UL,__IO_FILE_*,_void_(*)(_IO_FILE_*)>.
              super__Head_base<0UL,__IO_FILE_*,_false>);
  return __return_storage_ptr__;
}

Assistant:

string name_for_pid(pid_t pid) {
  string command = string_printf("ps -ax -c -o pid -o command | grep ^\\ *%u\\ | sed s/[0-9]*\\ //g", pid);
  auto f = popen_unique(command.c_str(), "r");

  string name;

  int ch;
  while ((ch = fgetc(f.get())) != EOF) {
    if (ch >= 0x20 && ch < 0x7F) {
      name += ch;
    }
  }

  return name;
}